

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-ast.c
# Opt level: O0

ztast_expr_t * ztast_expr_from_intarray(ztast_t *ast,ztast_intarray_t *intarr)

{
  ztast_expr_data in_RSI;
  long in_RDI;
  ztast_expr_t *expr;
  ztast_expr_t *local_8;
  
  local_8 = (ztast_expr_t *)(**(code **)(in_RDI + 8))(0x10,*(undefined8 *)(in_RDI + 0x18));
  if (local_8 == (ztast_expr_t *)0x0) {
    local_8 = (ztast_expr_t *)0x0;
  }
  else {
    local_8->type = ZTEXPR_INTARRAY;
    local_8->data = in_RSI;
  }
  return local_8;
}

Assistant:

ztast_expr_t *ztast_expr_from_intarray(ztast_t *ast, ztast_intarray_t *intarr)
{
  ztast_expr_t *expr;

  assert(ast);
  assert(intarr);

#ifdef ZTAST_LOG
  if (ast->logfn)
    ast->logfn("ztast_expr_from_array\n");
#endif

  expr = ZTAST_MALLOC(sizeof(*expr));
  if (expr == NULL)
    return NULL;

  expr->type          = ZTEXPR_INTARRAY;
  expr->data.intarray = intarr;

  return expr;
}